

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

TimeLevel __thiscall amrex::AmrLevel::which_time(AmrLevel *this,int indx,Real time)

{
  TimeLevel TVar1;
  Real RVar2;
  Real RVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  RVar2 = StateData::prevTime((this->state).
                              super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                              super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                              ._M_impl.super__Vector_impl_data._M_start + indx);
  RVar3 = StateData::curTime((this->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                             ._M_impl.super__Vector_impl_data._M_start + indx);
  dVar5 = RVar3 - RVar2;
  dVar6 = dVar5 * 0.001;
  if ((time < RVar2 - dVar6) || (TVar1 = AmrOldTime, RVar2 + dVar6 < time)) {
    if ((time < RVar3 - dVar6) || (RVar3 + dVar6 < time)) {
      dVar4 = (RVar3 + RVar2) * 0.5;
      if ((time < dVar4 - dVar6) || (dVar4 + dVar6 < time)) {
        dVar4 = dVar5 * 0.25 + RVar2;
        if ((time < dVar4 - dVar6) || (dVar4 + dVar6 < time)) {
          dVar5 = dVar5 * 0.75 + RVar2;
          TVar1 = (time < dVar5 - dVar6 || dVar5 + dVar6 < time) + Amr3QtrTime;
        }
        else {
          TVar1 = Amr1QtrTime;
        }
      }
      else {
        TVar1 = AmrHalfTime;
      }
    }
    else {
      TVar1 = AmrNewTime;
    }
  }
  return TVar1;
}

Assistant:

AmrLevel::TimeLevel
AmrLevel::which_time (int  indx, Real time) const noexcept
{
    const Real oldtime = state[indx].prevTime();
    const Real newtime = state[indx].curTime();
    const Real haftime = .5_rt * (oldtime + newtime);
    const Real qtime = oldtime + 0.25_rt*(newtime-oldtime);
    const Real tqtime = oldtime + 0.75_rt*(newtime-oldtime);
    const Real epsilon = 0.001_rt * (newtime - oldtime);

    BL_ASSERT(time >= oldtime-epsilon && time <= newtime+epsilon);

    if (time >= oldtime-epsilon && time <= oldtime+epsilon)
    {
        return AmrOldTime;
    }
    else if (time >= newtime-epsilon && time <= newtime+epsilon)
    {
        return AmrNewTime;
    }
    else if (time >= haftime-epsilon && time <= haftime+epsilon)
    {
        return AmrHalfTime;
    }
    else if (time >= qtime-epsilon && time <= qtime+epsilon)
    {
        return Amr1QtrTime;
    }
    else if (time >= tqtime-epsilon && time <= tqtime+epsilon)
    {
        return Amr3QtrTime;
    }
    return AmrOtherTime;
}